

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,FileEntry *a,FileEntry *b)

{
  pointer __s1;
  ulong size;
  pointer __s2;
  size_t size_00;
  int iVar1;
  size_t __n;
  
  __s1 = (a->encoded_name)._M_dataplus._M_p;
  size = (a->encoded_name)._M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  __s2 = (b->encoded_name)._M_dataplus._M_p;
  size_00 = (b->encoded_name)._M_string_length;
  if ((long)size_00 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size_00,"string length exceeds max size");
  }
  __n = size_00;
  if (size < size_00) {
    __n = size;
  }
  iVar1 = memcmp(__s1,__s2,__n);
  return iVar1 < 0 || iVar1 == 0 && size < size_00;
}

Assistant:

bool operator()(const FileEntry& a, const FileEntry& b) const {
      return a.name(index) < b.name(index);
    }